

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Version.cpp
# Opt level: O0

void __thiscall csm::Version::Version(Version *this,string *version)

{
  long lVar1;
  Error *pEVar2;
  char *pcVar3;
  int local_110;
  undefined1 local_10a;
  allocator<char> local_109;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  ErrorType local_c4;
  undefined1 local_c0 [8];
  string v;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ErrorType local_58 [4];
  undefined1 local_48 [8];
  string v_1;
  size_type dotPos;
  size_type pos;
  string *version_local;
  Version *this_local;
  
  memset(this,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(&this->theVersions);
  v_1.field_2._8_8_ = 0;
  while( true ) {
    v_1.field_2._8_8_ = std::__cxx11::string::find((char)version,0x2e);
    if (v_1.field_2._8_8_ == -1) {
      std::__cxx11::string::substr((ulong)local_c0,(ulong)version);
      lVar1 = std::__cxx11::string::find_first_not_of(local_c0,0x154947);
      if (lVar1 != -1) {
        local_10a = 1;
        pEVar2 = (Error *)__cxa_allocate_exception(0x50);
        local_c4 = INVALID_USE;
        std::operator+(&local_e8,"Invalid version component: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0
                      );
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"csm::Version::Version",&local_109);
        Error::Error(pEVar2,&local_c4,&local_e8,&local_108);
        local_10a = 0;
        __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
      }
      pcVar3 = (char *)std::__cxx11::string::c_str();
      local_110 = atoi(pcVar3);
      std::vector<int,_std::allocator<int>_>::push_back(&this->theVersions,&local_110);
      std::__cxx11::string::~string((string *)local_c0);
      return;
    }
    std::__cxx11::string::substr((ulong)local_48,(ulong)version);
    lVar1 = std::__cxx11::string::find_first_not_of(local_48,0x154947);
    if (lVar1 != -1) break;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    v.field_2._8_4_ = atoi(pcVar3);
    std::vector<int,_std::allocator<int>_>::push_back
              (&this->theVersions,(value_type_conflict1 *)(v.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_48);
  }
  v.field_2._M_local_buf[0xe] = '\x01';
  pEVar2 = (Error *)__cxa_allocate_exception(0x50);
  local_58[0] = INVALID_USE;
  std::operator+(&local_78,"Invalid version component: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"csm::Version::Version",
             (allocator<char> *)(v.field_2._M_local_buf + 0xf));
  Error::Error(pEVar2,local_58,&local_78,&local_98);
  v.field_2._M_local_buf[0xe] = '\0';
  __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

Version::Version(const std::string& version)
   :
      theVersions()
{
   static const char* const MODULE = "csm::Version::Version";

   // split on periods
   std::string::size_type pos = 0;
   std::string::size_type dotPos = 0;
   while ( (dotPos = version.find('.', pos)) != std::string::npos )
   {
      const std::string v = version.substr(pos, dotPos - pos);
      if (v.find_first_not_of("1234567890") != std::string::npos)
      {
         throw Error(Error::INVALID_USE, "Invalid version component: " + v,
                     MODULE);
      }

      theVersions.push_back(std::atoi(v.c_str()));
      pos = dotPos + 1;
   }

   // add the final version
   const std::string v = version.substr(pos);
   if (v.find_first_not_of("1234567890") != std::string::npos)
   {
      throw Error(Error::INVALID_USE, "Invalid version component: " + v,
                  MODULE);
   }
   theVersions.push_back(std::atoi(v.c_str()));
}